

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O0

bool __thiscall
AddrManImpl::Good_(AddrManImpl *this,CService *addr,bool test_before_evict,NodeSeconds time)

{
  ConstevalFormatString<3U> fmt;
  ConstevalFormatString<4U> fmt_00;
  byte bVar1;
  uint32_t uVar2;
  AddrInfo *netgroupman;
  bool *pbVar3;
  size_type sVar4;
  pointer in_RCX;
  byte in_DL;
  NetGroupManager *in_RSI;
  AddrInfo *in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<long>,_bool> pVar5;
  AddrInfo *info;
  AddrInfo *pinfo;
  uint32_t mapped_as;
  iterator colliding_entry;
  int tried_bucket_pos;
  int tried_bucket;
  nid_type nId;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 uVar6;
  int in_stack_fffffffffffffe2c;
  unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
  *in_stack_fffffffffffffe30;
  set<long,_std::less<long>,_std::allocator<long>_> *in_stack_fffffffffffffe38;
  nid_type *in_stack_fffffffffffffe40;
  CService *in_stack_fffffffffffffe48;
  AddrManImpl *in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  allocator<char> *in_stack_fffffffffffffe68;
  allocator<char> *paVar7;
  char *in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  AddrInfo *in_stack_fffffffffffffe88;
  LogFlags in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe9c;
  bool local_159;
  undefined8 in_stack_fffffffffffffea8;
  int bucket;
  AddrInfo *nKey;
  undefined7 in_stack_fffffffffffffec0;
  AddrInfo *info_00;
  undefined6 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffede;
  bool bVar8;
  allocator<char> in_stack_fffffffffffffedf;
  string_view in_stack_fffffffffffffee0;
  string_view in_stack_fffffffffffffef0;
  allocator<char> local_e9;
  _Node_iterator_base<std::pair<const_long,_AddrInfo>,_false> local_e8;
  _Node_iterator_base<std::pair<const_long,_AddrInfo>,_false> local_c0;
  int local_b4;
  int local_b0;
  undefined1 local_a9;
  pointer local_a0;
  _Base_ptr local_98;
  undefined1 local_90;
  Level in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe8;
  unsigned_long *in_stack_fffffffffffffff0;
  int *args_3;
  
  bucket = (int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  args_3 = *(int **)(in_FS_OFFSET + 0x28);
  bVar1 = in_DL & 1;
  info_00 = in_RDI;
  local_a0 = in_RCX;
  AssertLockHeldInternal<AnnotatedMixin<std::mutex>>
            ((char *)in_stack_fffffffffffffe38,(char *)in_stack_fffffffffffffe30,
             in_stack_fffffffffffffe2c,(AnnotatedMixin<std::mutex> *)0xee5a44);
  in_RDI[0x1403].super_CAddress.super_CService.super_CNetAddr.m_addr._union.indirect_contents.
  indirect = local_a0;
  netgroupman = Find(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  if (netgroupman == (AddrInfo *)0x0) {
    bVar8 = false;
  }
  else {
    (netgroupman->m_last_success).__d.__r = (rep)local_a0;
    (netgroupman->m_last_try).__d.__r = (rep)local_a0;
    netgroupman->nAttempts = 0;
    if ((netgroupman->fInTried & 1U) == 0) {
      local_a9 = 0 < netgroupman->nRefCount;
      nKey = netgroupman;
      pbVar3 = inline_assertion_check<false,bool>
                         ((bool *)in_stack_fffffffffffffe48,(char *)in_stack_fffffffffffffe40,
                          (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                          (char *)in_stack_fffffffffffffe30,
                          (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      if (((*pbVar3 ^ 0xffU) & 1) == 0) {
        local_b0 = AddrInfo::GetTriedBucket
                             ((AddrInfo *)CONCAT17(bVar1,in_stack_fffffffffffffec0),(uint256 *)nKey,
                              (NetGroupManager *)netgroupman);
        local_b4 = AddrInfo::GetBucketPosition
                             (in_stack_fffffffffffffe88,
                              (uint256 *)
                              CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                              SUB81((ulong)in_RDI >> 0x38,0),bucket);
        if (((bVar1 & 1) == 0) ||
           (*(long *)(&in_RDI[(long)local_b0 * 4 + 2].fInTried + (long)local_b4 * 8) == -1)) {
          MakeTried((AddrManImpl *)
                    CONCAT17(in_stack_fffffffffffffedf,
                             CONCAT16(in_stack_fffffffffffffede,in_stack_fffffffffffffed8)),info_00,
                    (nid_type)in_RSI);
          uVar2 = NetGroupManager::GetMappedAS
                            (in_RSI,(CNetAddr *)CONCAT17(bVar1,in_stack_fffffffffffffec0));
          bVar8 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                                      Trace);
          if (bVar8) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe48
                       ,(char *)in_stack_fffffffffffffe40);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe48
                       ,(char *)in_stack_fffffffffffffe40);
            CService::ToStringAddrPort_abi_cxx11_
                      ((CService *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
            bVar1 = 0;
            if (uVar2 == 0) {
              paVar7 = (allocator<char> *)&stack0xfffffffffffffedf;
              std::allocator<char>::allocator();
              bVar1 = 1;
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI
                         ,in_stack_fffffffffffffe70,paVar7);
            }
            else {
              tinyformat::format<unsigned_int>
                        (in_stack_fffffffffffffe58,(uint *)in_stack_fffffffffffffe50);
            }
            uVar6 = 1;
            fmt_00.fmt._6_1_ = in_stack_fffffffffffffede;
            fmt_00.fmt._0_6_ = in_stack_fffffffffffffed8;
            fmt_00.fmt._7_1_ = in_stack_fffffffffffffedf;
            LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string,int,int>
                      (in_stack_fffffffffffffef0,in_stack_fffffffffffffee0,in_stack_fffffffffffffe9c
                       ,in_stack_fffffffffffffe90,in_stack_ffffffffffffffd0,fmt_00,
                       in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8,
                       (int *)in_stack_fffffffffffffff0,args_3);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffe2c,uVar6));
            if ((bVar1 & 1) != 0) {
              std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffedf);
            }
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffe2c,uVar6));
          }
          bVar8 = true;
        }
        else {
          sVar4 = std::set<long,_std::less<long>,_std::allocator<long>_>::size
                            ((set<long,_std::less<long>,_std::allocator<long>_> *)
                             CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
          if (sVar4 < 10) {
            pVar5 = std::set<long,_std::less<long>,_std::allocator<long>_>::insert
                              (in_stack_fffffffffffffe38,
                               (value_type_conflict6 *)in_stack_fffffffffffffe30);
            local_98 = (_Base_ptr)pVar5.first._M_node;
            local_90 = pVar5.second;
          }
          local_c0._M_cur =
               (__node_type *)
               std::
               unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
               ::find(in_stack_fffffffffffffe30,
                      (key_type *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
          bVar8 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                                      Trace);
          if (bVar8) {
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe48
                       ,(char *)in_stack_fffffffffffffe40);
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe48
                       ,(char *)in_stack_fffffffffffffe40);
            local_e8._M_cur =
                 (__node_type *)
                 std::
                 unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
                 ::end(in_stack_fffffffffffffe30);
            bVar8 = std::__detail::operator==
                              ((_Node_iterator_base<std::pair<const_long,_AddrInfo>,_false> *)
                               in_stack_fffffffffffffe38,
                               (_Node_iterator_base<std::pair<const_long,_AddrInfo>,_false> *)
                               in_stack_fffffffffffffe30);
            local_159 = ((bVar8 ^ 0xffU) & 1) != 0;
            if (local_159) {
              std::__detail::_Node_iterator<std::pair<const_long,_AddrInfo>,_false,_false>::
              operator->((_Node_iterator<std::pair<const_long,_AddrInfo>,_false,_false> *)
                         CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
              CService::ToStringAddrPort_abi_cxx11_
                        ((CService *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
            }
            else {
              paVar7 = &local_e9;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI
                         ,(char *)paVar7,in_stack_fffffffffffffe68);
            }
            local_159 = !local_159;
            CService::ToStringAddrPort_abi_cxx11_
                      ((CService *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
            std::set<long,_std::less<long>,_std::allocator<long>_>::size
                      ((set<long,_std::less<long>,_std::allocator<long>_> *)
                       CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
            uVar6 = 1;
            fmt.fmt._6_1_ = in_stack_fffffffffffffede;
            fmt.fmt._0_6_ = in_stack_fffffffffffffed8;
            fmt.fmt._7_1_ = in_stack_fffffffffffffedf;
            LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string,unsigned_long>
                      (in_stack_fffffffffffffef0,in_stack_fffffffffffffee0,in_stack_fffffffffffffe9c
                       ,in_stack_fffffffffffffe90,in_stack_ffffffffffffffd0,fmt,
                       in_stack_ffffffffffffffe0,in_stack_ffffffffffffffe8,in_stack_fffffffffffffff0
                      );
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffe2c,uVar6));
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffe2c,uVar6));
            if (local_159) {
              std::allocator<char>::~allocator(&local_e9);
            }
          }
          bVar8 = false;
        }
      }
      else {
        bVar8 = false;
      }
    }
    else {
      bVar8 = false;
    }
  }
  if (*(int **)(in_FS_OFFSET + 0x28) != args_3) {
    __stack_chk_fail();
  }
  return bVar8;
}

Assistant:

bool AddrManImpl::Good_(const CService& addr, bool test_before_evict, NodeSeconds time)
{
    AssertLockHeld(cs);

    nid_type nId;

    m_last_good = time;

    AddrInfo* pinfo = Find(addr, &nId);

    // if not found, bail out
    if (!pinfo) return false;

    AddrInfo& info = *pinfo;

    // update info
    info.m_last_success = time;
    info.m_last_try = time;
    info.nAttempts = 0;
    // nTime is not updated here, to avoid leaking information about
    // currently-connected peers.

    // if it is already in the tried set, don't do anything else
    if (info.fInTried) return false;

    // if it is not in new, something bad happened
    if (!Assume(info.nRefCount > 0)) return false;


    // which tried bucket to move the entry to
    int tried_bucket = info.GetTriedBucket(nKey, m_netgroupman);
    int tried_bucket_pos = info.GetBucketPosition(nKey, false, tried_bucket);

    // Will moving this address into tried evict another entry?
    if (test_before_evict && (vvTried[tried_bucket][tried_bucket_pos] != -1)) {
        if (m_tried_collisions.size() < ADDRMAN_SET_TRIED_COLLISION_SIZE) {
            m_tried_collisions.insert(nId);
        }
        // Output the entry we'd be colliding with, for debugging purposes
        auto colliding_entry = mapInfo.find(vvTried[tried_bucket][tried_bucket_pos]);
        LogDebug(BCLog::ADDRMAN, "Collision with %s while attempting to move %s to tried table. Collisions=%d\n",
                 colliding_entry != mapInfo.end() ? colliding_entry->second.ToStringAddrPort() : "",
                 addr.ToStringAddrPort(),
                 m_tried_collisions.size());
        return false;
    } else {
        // move nId to the tried tables
        MakeTried(info, nId);
        const auto mapped_as{m_netgroupman.GetMappedAS(addr)};
        LogDebug(BCLog::ADDRMAN, "Moved %s%s to tried[%i][%i]\n",
                 addr.ToStringAddrPort(), (mapped_as ? strprintf(" mapped to AS%i", mapped_as) : ""), tried_bucket, tried_bucket_pos);
        return true;
    }
}